

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * __thiscall
soul::Value::tryCastToType
          (Value *__return_storage_ptr__,Value *this,Type *destType,CompileMessage *errorMessage)

{
  SourceCodeText *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8;
  string local_98;
  CompileMessage local_78;
  string local_40;
  
  tryCastToType(__return_storage_ptr__,this,destType);
  if ((__return_storage_ptr__->type).category != invalid) {
    return __return_storage_ptr__;
  }
  if ((this->type).category == primitive) {
    getDescription_abi_cxx11_(&local_98,this,(StringDictionary *)0x0);
    Type::getDescription_abi_cxx11_(&local_b8,&this->type);
    Type::getDescription_abi_cxx11_(&local_40,destType);
    CompileMessageHelpers::
    createMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_78,(CompileMessageHelpers *)0x1,none,0x2afbd0,(char *)&local_98,&local_b8,
               &local_40,in_stack_ffffffffffffff40);
    std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_78);
    pSVar1 = (errorMessage->location).sourceCode.object;
    if (local_78.location.sourceCode.object != pSVar1) {
      (errorMessage->location).sourceCode.object = local_78.location.sourceCode.object;
      local_78.location.sourceCode.object = (SourceCodeText *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
    }
    (errorMessage->location).location.data = local_78.location.location.data;
    errorMessage->type = local_78.type;
    errorMessage->category = local_78.category;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.description._M_dataplus._M_p != &local_78.description.field_2) {
      operator_delete(local_78.description._M_dataplus._M_p,
                      local_78.description.field_2._M_allocated_capacity + 1);
    }
    local_78.description.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    local_78.description._M_dataplus._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_001c0206;
  }
  else {
    Type::getDescription_abi_cxx11_(&local_98,&this->type);
    Type::getDescription_abi_cxx11_(&local_b8,destType);
    CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
              (&local_78,(CompileMessageHelpers *)0x1,none,0x2898e3,(char *)&local_98,&local_b8,
               in_stack_ffffffffffffff38);
    std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_78);
    pSVar1 = (errorMessage->location).sourceCode.object;
    if (local_78.location.sourceCode.object != pSVar1) {
      (errorMessage->location).sourceCode.object = local_78.location.sourceCode.object;
      local_78.location.sourceCode.object = (SourceCodeText *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
    }
    (errorMessage->location).location.data = local_78.location.location.data;
    errorMessage->type = local_78.type;
    errorMessage->category = local_78.category;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.description._M_dataplus._M_p == &local_78.description.field_2)
    goto LAB_001c0206;
  }
  operator_delete(local_78.description._M_dataplus._M_p,
                  local_78.description.field_2._M_allocated_capacity + 1);
LAB_001c0206:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType, CompileMessage& errorMessage) const
{
    auto result = tryCastToType (destType);

    if (! result.isValid())
    {
        if (type.isPrimitive())
            errorMessage = Errors::cannotCastValue (getDescription(), type.getDescription(), destType.getDescription());
        else
            errorMessage = Errors::cannotCastBetween (type.getDescription(), destType.getDescription());
    }

    return result;
}